

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_rand.cpp
# Opt level: O3

void __thiscall crnlib::well512::seed(well512 *this,uint32 seed1,uint32 seed2,uint32 seed3)

{
  uint i;
  long lVar1;
  uint32 jcong;
  uint32 jsr;
  uint uVar2;
  
  lVar1 = 0;
  do {
    uVar2 = seed2 << 0x11 ^ seed2;
    uVar2 = uVar2 >> 0xd ^ uVar2;
    seed2 = uVar2 << 5 ^ uVar2;
    uVar2 = seed1 * 0x1001 + 0x7ed55d16;
    uVar2 = uVar2 >> 0x13 ^ uVar2 ^ 0xc761c23c;
    uVar2 = (uVar2 * 0x4200 + 0xaccf6200 ^ uVar2 * 0x21 + 0xe9f8cc1d) * 9 + 0xfd7046c5;
    seed1 = uVar2 >> 0x10 ^ uVar2 ^ 0xb55a4f09;
    seed3 = seed3 * 0x10dcd + 0x12d687;
    this->m_state[lVar1] = seed2 ^ seed3 ^ seed1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  this->m_index = 0;
  return;
}

Assistant:

void well512::seed(uint32 seed1, uint32 seed2, uint32 seed3) {
  uint32 jsr = seed2;
  uint32 jcong = seed3;

  for (uint i = 0; i < cStateSize; i++) {
    SHR3;
    seed1 = bitmix32c(seed1);
    CONG;

    m_state[i] = seed1 ^ jsr ^ jcong;
  }
  m_index = 0;
}